

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

void __thiscall Fl_Text_Display::wrap_mode(Fl_Text_Display *this,int wrap,int wrapMargin)

{
  int iVar1;
  double dVar2;
  
  if (wrap == 0) {
    wrapMargin = 0;
    iVar1 = 0;
  }
  else {
    if (wrap != 2) {
      if (wrap == 3) {
        iVar1 = 1;
        wrapMargin = 0;
        goto LAB_001ce0cc;
      }
      dVar2 = col_to_x(this,(double)wrapMargin);
      wrapMargin = (int)dVar2;
    }
    iVar1 = 1;
  }
LAB_001ce0cc:
  this->mWrapMarginPix = wrapMargin;
  this->mContinuousWrap = iVar1;
  if (this->mBuffer == (Fl_Text_Buffer *)0x0) {
    this->mNBufferLines = 0;
    this->mFirstChar = 0;
    this->mTopLineNum = 1;
    this->mAbsTopLineNum = 1;
  }
  else {
    iVar1 = count_lines(this,0,this->mBuffer->mLength,true);
    this->mNBufferLines = iVar1;
    iVar1 = line_start(this,this->mFirstChar);
    this->mFirstChar = iVar1;
    iVar1 = count_lines(this,0,iVar1,true);
    this->mTopLineNum = iVar1 + 1;
    reset_absolute_top_line_number(this);
    calc_line_starts(this,0,this->mNVisibleLines);
    calc_last_char(this);
  }
  (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
            (this,(ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.x_,
             (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.y_,
             (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.w_,
             (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.h_);
  return;
}

Assistant:

void Fl_Text_Display::wrap_mode(int wrap, int wrapMargin) {
  switch (wrap) {
    case WRAP_NONE:
      mWrapMarginPix = 0;
      mContinuousWrap = 0;
      break;
    case WRAP_AT_COLUMN:
    default:
      mWrapMarginPix = int(col_to_x(wrapMargin));
      mContinuousWrap = 1;
      break;
    case WRAP_AT_PIXEL:
      mWrapMarginPix = wrapMargin;
      mContinuousWrap = 1;
      break;
    case WRAP_AT_BOUNDS:
      mWrapMarginPix = 0;
      mContinuousWrap = 1;
      break;
  }

  if (buffer()) {
    /* wrapping can change the total number of lines, re-count */
    mNBufferLines = count_lines(0, buffer()->length(), true);

    /* changing wrap margins or changing from wrapped mode to non-wrapped
     can leave the character at the top no longer at a line start, and/or
     change the line number */
    mFirstChar = line_start(mFirstChar);
    mTopLineNum = count_lines(0, mFirstChar, true) + 1;

    reset_absolute_top_line_number();

    /* update the line starts array */
    calc_line_starts(0, mNVisibleLines);
    calc_last_char();
  } else {
    // No buffer, so just clear the state info for later...
    mNBufferLines  = 0;
    mFirstChar     = 0;
    mTopLineNum    = 1;
    mAbsTopLineNum = 1;		// changed from 0 to 1 -- LZA / STR#2621
  }

  resize(x(), y(), w(), h());
}